

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

void equip_learn_on_ranged_attack(player *p)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object *obj;
  size_t sVar4;
  player_shape *ppVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  wchar_t slot;
  
  if (p->obj_k->to_h == 0) {
    if ((p->body).count != 0) {
      slot = L'\0';
      do {
        obj = slot_object(p,slot);
        wVar3 = slot_by_name(p,"weapon");
        bVar1 = false;
        if ((slot != wVar3) && (wVar3 = slot_by_name(p,"shooting"), slot != wVar3)) {
          if (obj != (object *)0x0) {
            if (obj->known == (object *)0x0) {
              __assert_fail("obj->known",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/obj-knowledge.c"
                            ,0x7be,"void equip_learn_on_ranged_attack(struct player *)");
            }
            _Var2 = object_has_standard_to_h(obj);
            if (!_Var2) {
              sVar8 = 0xffffffffffffffff;
              if (rune_max != 0) {
                piVar6 = &rune_list->index;
                lVar7 = 0;
                sVar4 = rune_max;
                do {
                  if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 1)) {
                    sVar8 = lVar7 >> 0x20;
                    break;
                  }
                  lVar7 = lVar7 + 0x100000000;
                  piVar6 = piVar6 + 6;
                  sVar4 = sVar4 - 1;
                } while (sVar4 != 0);
              }
              player_learn_rune(p,sVar8,true);
            }
            object_curses_find_to_h(p,obj);
            bVar1 = true;
            if (p->obj_k->to_h != 0) goto LAB_0018c2ce;
          }
          bVar1 = false;
        }
LAB_0018c2ce:
        if (bVar1) {
          return;
        }
        slot = slot + L'\x01';
      } while ((uint)slot < (uint)(p->body).count);
    }
    if ((p->shape != (player_shape *)0x0) &&
       (ppVar5 = lookup_player_shape(p->shape->name), ppVar5->to_h != L'\0')) {
      sVar8 = 0xffffffffffffffff;
      if (rune_max != 0) {
        piVar6 = &rune_list->index;
        lVar7 = 0;
        sVar4 = rune_max;
        do {
          if ((((rune *)(piVar6 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar6 == 1)) {
            sVar8 = lVar7 >> 0x20;
            break;
          }
          lVar7 = lVar7 + 0x100000000;
          piVar6 = piVar6 + 6;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      player_learn_rune(p,sVar8,true);
      return;
    }
  }
  return;
}

Assistant:

void equip_learn_on_ranged_attack(struct player *p)
{
	int i;

	if (p->obj_k->to_h) return;

	for (i = 0; i < p->body.count; i++) {
		struct object *obj = slot_object(p, i);
		if (i == slot_by_name(p, "weapon")) continue;
		if (i == slot_by_name(p, "shooting")) continue;
		if (obj) {
			assert(obj->known);
			if (!object_has_standard_to_h(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
				player_learn_rune(p, index, true);
			}
			object_curses_find_to_h(p, obj);
			if (p->obj_k->to_h) return;
		}
	}
	if (p->shape) {
		struct player_shape *shape = lookup_player_shape(p->shape->name);
		if (shape->to_h != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
			player_learn_rune(p, index, true);
		}
	}
}